

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall vera::Image::set(Image *this,uint8_t *_array3D,int _height,int _width,int _channels)

{
  pointer pfVar1;
  ulong uVar2;
  ulong __new_size;
  
  (*this->_vptr_Image[4])(this,(long)_width,(long)_height,(long)_channels);
  __new_size = (long)this->m_channels * (long)this->m_height * (long)this->m_width;
  std::vector<float,_std::allocator<float>_>::resize(&this->m_data,__new_size);
  if (0 < (int)__new_size) {
    pfVar1 = (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    do {
      pfVar1[uVar2] = (float)_array3D[uVar2] / 255.0;
      uVar2 = uVar2 + 1;
    } while ((__new_size & 0xffffffff) != uVar2);
  }
  return;
}

Assistant:

void Image::set(const uint8_t* _array3D, int _height, int _width, int _channels) {
    allocate(_width, _height, _channels);
    int total = m_width * m_height * m_channels;
    m_data.resize(total);
    for (int i = 0; i < total; i++)
        m_data[i] = _array3D[i]/255.0f;
}